

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to_queued_task.h
# Opt level: O0

void __thiscall
dd::
ClosureTask<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/boss-li[P]quick/quick/quick_impl.cc:110:25)>
::~ClosureTask(ClosureTask<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_boss_li[P]quick_quick_quick_impl_cc:110:25)>
               *this)

{
  ClosureTask<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_boss_li[P]quick_quick_quick_impl_cc:110:25)>
  *this_local;
  
  ~ClosureTask(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

explicit ClosureTask(Closure&& closure) :_closure(std::forward<Closure>(closure)) {}